

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O0

BOOLEAN __thiscall BVFixed::TestAndSet(BVFixed *this,BVIndex i)

{
  BOOLEAN BVar1;
  BVIndex index;
  BVUnit *this_00;
  BOOLEAN bit;
  BVIndex offset;
  BVUnit *bvUnit;
  BVIndex i_local;
  BVFixed *this_local;
  
  AssertRange(this,i);
  this_00 = BitsFromIndex(this,i);
  index = BVUnitT<unsigned_long>::Offset(i);
  BVar1 = BVUnitT<unsigned_long>::Test(this_00,index);
  BVUnitT<unsigned_long>::Set(this_00,index);
  return BVar1;
}

Assistant:

BOOLEAN
BVFixed::TestAndSet(BVIndex i)
{
    AssertRange(i);
    BVUnit * bvUnit = this->BitsFromIndex(i);
    BVIndex offset = BVUnit::Offset(i);
    BOOLEAN bit = bvUnit->Test(offset);
    bvUnit->Set(offset);
    return bit;
}